

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::MutablePatternModifier::MutablePatternModifier
          (MutablePatternModifier *this,bool isStrong)

{
  bool isStrong_local;
  MutablePatternModifier *this_local;
  
  MicroPropsGenerator::MicroPropsGenerator(&this->super_MicroPropsGenerator);
  Modifier::Modifier(&this->super_Modifier);
  SymbolProvider::SymbolProvider(&this->super_SymbolProvider);
  (this->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
       (_func_int **)&PTR__MutablePatternModifier_004fe738;
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__MutablePatternModifier_004fe7a0;
  (this->super_SymbolProvider)._vptr_SymbolProvider =
       (_func_int **)&PTR__MutablePatternModifier_004fe7f8;
  this->fStrong = isStrong;
  UnicodeString::UnicodeString(&this->currentAffix);
  return;
}

Assistant:

MutablePatternModifier::MutablePatternModifier(bool isStrong)
        : fStrong(isStrong) {}